

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_ec_sig_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
              uchar *bytes_out,size_t len)

{
  int iVar1;
  wally_operations *pwVar2;
  secp256k1_context_struct *ctx;
  uchar *puVar3;
  leint32_t tmp;
  int iVar4;
  int recid;
  uchar *local_a8;
  wally_ec_nonce_t local_a0;
  uchar extra_entropy [32];
  secp256k1_ecdsa_recoverable_signature sig_secp;
  
  pwVar2 = wally_ops();
  local_a0 = pwVar2->ec_nonce_fn;
  ctx = secp_ctx();
  iVar1 = -2;
  if (((((bytes_len == 0x20 && priv_key_len == 0x20) &&
         (bytes != (uchar *)0x0 && priv_key != (uchar *)0x0)) && ((flags & 3) - 1 < 2)) &&
      (bytes_out != (uchar *)0x0 && flags < 0x10)) && (0x41 - (ulong)(flags < 8) == len)) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar1 = -3;
    }
    else if ((flags & 2) == 0) {
      extra_entropy[0x10] = '\0';
      extra_entropy[0x11] = '\0';
      extra_entropy[0x12] = '\0';
      extra_entropy[0x13] = '\0';
      extra_entropy[0x14] = '\0';
      extra_entropy[0x15] = '\0';
      extra_entropy[0x16] = '\0';
      extra_entropy[0x17] = '\0';
      extra_entropy[0x18] = '\0';
      extra_entropy[0x19] = '\0';
      extra_entropy[0x1a] = '\0';
      extra_entropy[0x1b] = '\0';
      extra_entropy[0x1c] = '\0';
      extra_entropy[0x1d] = '\0';
      extra_entropy[0x1e] = '\0';
      extra_entropy[0x1f] = '\0';
      extra_entropy[0] = '\0';
      extra_entropy[1] = '\0';
      extra_entropy[2] = '\0';
      extra_entropy[3] = '\0';
      extra_entropy[4] = '\0';
      extra_entropy[5] = '\0';
      extra_entropy[6] = '\0';
      extra_entropy[7] = '\0';
      extra_entropy[8] = '\0';
      extra_entropy[9] = '\0';
      extra_entropy[10] = '\0';
      extra_entropy[0xb] = '\0';
      extra_entropy[0xc] = '\0';
      extra_entropy[0xd] = '\0';
      extra_entropy[0xe] = '\0';
      extra_entropy[0xf] = '\0';
      local_a8 = bytes_out + (7 < flags);
      puVar3 = (uchar *)0x0;
      iVar1 = 1;
      while (iVar4 = iVar1,
            iVar1 = secp256k1_ecdsa_sign_recoverable(ctx,&sig_secp,bytes,priv_key,local_a0,puVar3),
            puVar3 = local_a8, iVar1 != 0) {
        secp256k1_ecdsa_recoverable_signature_serialize_compact(ctx,local_a8,&recid,&sig_secp);
        if (((flags & 4) == 0) || (-1 < (char)*puVar3)) {
          wally_clear(&sig_secp,0x41);
          if (flags < 8) {
            return 0;
          }
          *bytes_out = (char)recid + '\x1f';
          return 0;
        }
        puVar3 = extra_entropy;
        iVar1 = iVar4 + 1;
        extra_entropy._0_4_ = iVar4;
      }
      wally_clear(&sig_secp,0x41);
      iVar1 = secp256k1_ec_seckey_verify(ctx,priv_key);
      iVar1 = -1 - (uint)(iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

int wally_ec_sig_from_bytes(const unsigned char *priv_key, size_t priv_key_len,
                            const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags,
                            unsigned char *bytes_out, size_t len)
{
    wally_ec_nonce_t nonce_fn = wally_ops()->ec_nonce_fn;
    const secp256k1_context *ctx = secp_ctx();

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !is_valid_ec_type(flags) || flags & ~EC_FLAGS_ALL ||
        !bytes_out || len != get_expected_sig_len(flags))
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (flags & EC_FLAG_SCHNORR) {
        if (flags & EC_FLAG_RECOVERABLE)
            return WALLY_EINVAL; /* Only ECDSA is supported for recoverable sigs */

#if 0 /*FIXME: Schnorr is unavailable in secp for now*/
        if (!secp256k1_schnorr_sign(ctx, bytes_out, bytes,
                                    priv_key, nonce_fn, NULL))
            return WALLY_EINVAL; /* Failed to sign */
        return WALLY_OK;
#endif
        return WALLY_EINVAL;
    } else {
        unsigned char extra_entropy[32] = {0}, *entropy_p = NULL;
        unsigned char *bytes_out_p = flags & EC_FLAG_RECOVERABLE ? bytes_out + 1 : bytes_out;
        uint32_t counter = 0;
        secp256k1_ecdsa_recoverable_signature sig_secp;
        int recid;

        while (true) {
            if (!secp256k1_ecdsa_sign_recoverable(ctx, &sig_secp, bytes, priv_key, nonce_fn, entropy_p)) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                if (!secp256k1_ec_seckey_verify(ctx, priv_key))
                    return WALLY_EINVAL; /* invalid priv_key */
                return WALLY_ERROR;     /* Nonce function failed */
            }

            /* Note this function is documented as never failing */
            secp256k1_ecdsa_recoverable_signature_serialize_compact(ctx, bytes_out_p, &recid, &sig_secp);

            if (!(flags & EC_FLAG_GRIND_R) || *bytes_out_p < 0x80) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                /* Note the following assumes the key is compressed */
                if (flags & EC_FLAG_RECOVERABLE)
                    bytes_out[0] = 27 + recid + 4;

                return WALLY_OK;
            }
            /* Incremement nonce to grind for low-R */
            entropy_p = extra_entropy;
            ++counter;
            uint32_to_le_bytes(counter, entropy_p);
        }
    }
}